

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

int md_is_dec_entity_contents
              (MD_CTX *ctx,MD_CHAR *text,MD_OFFSET beg,MD_OFFSET max_end,MD_OFFSET *p_end)

{
  bool bVar1;
  MD_OFFSET off;
  MD_OFFSET *p_end_local;
  MD_OFFSET max_end_local;
  MD_OFFSET beg_local;
  MD_CHAR *text_local;
  MD_CTX *ctx_local;
  int local_4;
  
  off = beg;
  while( true ) {
    bVar1 = false;
    if (((off < max_end) && (bVar1 = false, 0x2f < (byte)text[off])) &&
       (bVar1 = false, (byte)text[off] < 0x3a)) {
      bVar1 = off - beg < 9;
    }
    if (!bVar1) break;
    off = off + 1;
  }
  if ((off == beg) || (7 < off - beg)) {
    local_4 = 0;
  }
  else {
    *p_end = off;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int
md_is_dec_entity_contents(MD_CTX* ctx, const CHAR* text, OFF beg, OFF max_end, OFF* p_end)
{
    OFF off = beg;
    MD_UNUSED(ctx);

    while(off < max_end  &&  ISDIGIT_(text[off])  &&  off - beg <= 8)
        off++;

    if(1 <= off - beg  &&  off - beg <= 7) {
        *p_end = off;
        return TRUE;
    } else {
        return FALSE;
    }
}